

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_thr.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__s;
  size_t __size;
  
  if (argc == 4) {
    pcVar1 = argv[1];
    iVar2 = atoi(argv[2]);
    iVar3 = atoi(argv[3]);
    iVar4 = nn_socket(1,0x10);
    if (iVar4 == -1) {
      __assert_fail("s != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_thr.c"
                    ,0x33,"int main(int, char **)");
    }
    iVar5 = nn_connect(iVar4,pcVar1);
    if (iVar5 < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_thr.c"
                    ,0x35,"int main(int, char **)");
    }
    __size = (size_t)iVar2;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      __assert_fail("buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_thr.c"
                    ,0x38,"int main(int, char **)");
    }
    memset(__s,0x6f,__size);
    iVar5 = nn_send(iVar4,__s,0,0);
    if (iVar5 != 0) {
      __assert_fail("nbytes == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_thr.c"
                    ,0x3c,"int main(int, char **)");
    }
    for (; iVar3 != 0; iVar3 = iVar3 + -1) {
      iVar5 = nn_send(iVar4,__s,__size,0);
      if (iVar5 != iVar2) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_thr.c"
                      ,0x40,"int main(int, char **)");
      }
    }
    free(__s);
    iVar2 = nn_close(iVar4);
    iVar3 = 0;
    if (iVar2 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_thr.c"
                    ,0x46,"int main(int, char **)");
    }
  }
  else {
    puts("usage: remote_thr <connect-to> <msg-size> <msg-count>");
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main (int argc, char *argv [])
{
    const char *connect_to;
    size_t sz;
    int count;
    char *buf;
    int nbytes;
    int s;
    int rc;
    int i;

    if (argc != 4) {
        printf ("usage: remote_thr <connect-to> <msg-size> <msg-count>\n");
        return 1;
    }
    connect_to = argv [1];
    sz = atoi (argv [2]);
    count = atoi (argv [3]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    rc = nn_connect (s, connect_to);
    assert (rc >= 0);

    buf = malloc (sz);
    assert (buf);
    memset (buf, 111, sz);

    nbytes = nn_send (s, buf, 0, 0);
    assert (nbytes == 0);

    for (i = 0; i != count; i++) {
        nbytes = nn_send (s, buf, sz, 0);
        assert (nbytes == (int)sz);
    }

    free (buf);

    rc = nn_close (s);
    assert (rc == 0);

    return 0;
}